

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode Curl_close(Curl_easy **datap)

{
  Curl_easy *data_00;
  Curl_easy *data;
  Curl_easy **datap_local;
  
  if ((datap != (Curl_easy **)0x0) && (*datap != (Curl_easy *)0x0)) {
    data_00 = *datap;
    *datap = (Curl_easy *)0x0;
    Curl_detach_connection(data_00);
    if ((*(uint *)&(data_00->state).field_0x7be >> 0x14 & 1) == 0) {
      if (data_00->multi != (Curl_multi *)0x0) {
        curl_multi_remove_handle(data_00->multi,data_00);
      }
      if (data_00->multi_easy != (Curl_multi *)0x0) {
        curl_multi_cleanup(data_00->multi_easy);
        data_00->multi_easy = (Curl_multi *)0x0;
      }
    }
    Curl_expire_clear(data_00);
    data_00->magic = 0;
    if ((*(uint *)&(data_00->state).field_0x7be >> 0xb & 1) != 0) {
      (*Curl_cfree)((data_00->state).range);
    }
    Curl_req_free(&data_00->req,data_00);
    Curl_ssl_close_all(data_00);
    (*Curl_cfree)((data_00->state).first_host);
    (data_00->state).first_host = (char *)0x0;
    Curl_ssl_free_certinfo(data_00);
    if ((*(uint *)&(data_00->state).field_0x7be >> 0x11 & 1) != 0) {
      (*Curl_cfree)((data_00->state).referer);
      (data_00->state).referer = (char *)0x0;
      *(uint *)&(data_00->state).field_0x7be = *(uint *)&(data_00->state).field_0x7be & 0xfffdffff;
    }
    (data_00->state).referer = (char *)0x0;
    up_free(data_00);
    Curl_dyn_free(&(data_00->state).headerb);
    Curl_flush_cookies(data_00,true);
    Curl_altsvc_save(data_00,data_00->asi,(data_00->set).str[0x40]);
    Curl_altsvc_cleanup(&data_00->asi);
    Curl_hsts_save(data_00,data_00->hsts,(data_00->set).str[0x41]);
    if ((data_00->share == (Curl_share *)0x0) || (data_00->share->hsts == (hsts *)0x0)) {
      Curl_hsts_cleanup(&data_00->hsts);
    }
    curl_slist_free_all((data_00->state).hstslist);
    Curl_http_auth_cleanup_digest(data_00);
    (*Curl_cfree)((data_00->state).most_recent_ftp_entrypath);
    (data_00->state).most_recent_ftp_entrypath = (char *)0x0;
    (*Curl_cfree)((data_00->info).contenttype);
    (data_00->info).contenttype = (char *)0x0;
    (*Curl_cfree)((data_00->info).wouldredirect);
    (data_00->info).wouldredirect = (char *)0x0;
    Curl_async_destroy(data_00);
    if (data_00->share != (Curl_share *)0x0) {
      Curl_share_lock(data_00,CURL_LOCK_DATA_SHARE,CURL_LOCK_ACCESS_SINGLE);
      data_00->share->dirty = data_00->share->dirty - 1;
      Curl_share_unlock(data_00,CURL_LOCK_DATA_SHARE);
    }
    Curl_hash_destroy(&data_00->meta_hash);
    (*Curl_cfree)((data_00->state).aptr.proxyuserpwd);
    (data_00->state).aptr.proxyuserpwd = (char *)0x0;
    (*Curl_cfree)((data_00->state).aptr.uagent);
    (data_00->state).aptr.uagent = (char *)0x0;
    (*Curl_cfree)((data_00->state).aptr.userpwd);
    (data_00->state).aptr.userpwd = (char *)0x0;
    (*Curl_cfree)((data_00->state).aptr.accept_encoding);
    (data_00->state).aptr.accept_encoding = (char *)0x0;
    (*Curl_cfree)((data_00->state).aptr.te);
    (data_00->state).aptr.te = (char *)0x0;
    (*Curl_cfree)((data_00->state).aptr.rangeline);
    (data_00->state).aptr.rangeline = (char *)0x0;
    (*Curl_cfree)((data_00->state).aptr.ref);
    (data_00->state).aptr.ref = (char *)0x0;
    (*Curl_cfree)((data_00->state).aptr.host);
    (data_00->state).aptr.host = (char *)0x0;
    (*Curl_cfree)((data_00->state).aptr.cookiehost);
    (data_00->state).aptr.cookiehost = (char *)0x0;
    (*Curl_cfree)((data_00->state).aptr.rtsp_transport);
    (data_00->state).aptr.rtsp_transport = (char *)0x0;
    (*Curl_cfree)((data_00->state).aptr.user);
    (data_00->state).aptr.user = (char *)0x0;
    (*Curl_cfree)((data_00->state).aptr.passwd);
    (data_00->state).aptr.passwd = (char *)0x0;
    (*Curl_cfree)((data_00->state).aptr.proxyuser);
    (data_00->state).aptr.proxyuser = (char *)0x0;
    (*Curl_cfree)((data_00->state).aptr.proxypasswd);
    (data_00->state).aptr.proxypasswd = (char *)0x0;
    Curl_mime_cleanpart((data_00->state).formp);
    (*Curl_cfree)((data_00->state).formp);
    (data_00->state).formp = (curl_mimepart *)0x0;
    Curl_wildcard_dtor(&data_00->wildcard);
    Curl_freeset(data_00);
    Curl_headers_cleanup(data_00);
    Curl_netrc_cleanup(&(data_00->state).netrc);
    (*Curl_cfree)(data_00);
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_close(struct Curl_easy **datap)
{
  struct Curl_easy *data;

  if(!datap || !*datap)
    return CURLE_OK;

  data = *datap;
  *datap = NULL;

  /* Detach connection if any is left. This should not be normal, but can be
     the case for example with CONNECT_ONLY + recv/send (test 556) */
  Curl_detach_connection(data);
  if(!data->state.internal) {
    if(data->multi)
      /* This handle is still part of a multi handle, take care of this first
         and detach this handle from there. */
      curl_multi_remove_handle(data->multi, data);

    if(data->multi_easy) {
      /* when curl_easy_perform() is used, it creates its own multi handle to
         use and this is the one */
      curl_multi_cleanup(data->multi_easy);
      data->multi_easy = NULL;
    }
  }

  Curl_expire_clear(data); /* shut off any timers left */

  data->magic = 0; /* force a clear AFTER the possibly enforced removal from
                      the multi handle, since that function uses the magic
                      field! */

  if(data->state.rangestringalloc)
    free(data->state.range);

  /* freed here just in case DONE was not called */
  Curl_req_free(&data->req, data);

  /* Close down all open SSL info and sessions */
  Curl_ssl_close_all(data);
  Curl_safefree(data->state.first_host);
  Curl_ssl_free_certinfo(data);

  if(data->state.referer_alloc) {
    Curl_safefree(data->state.referer);
    data->state.referer_alloc = FALSE;
  }
  data->state.referer = NULL;

  up_free(data);
  Curl_dyn_free(&data->state.headerb);
  Curl_flush_cookies(data, TRUE);
#ifndef CURL_DISABLE_ALTSVC
  Curl_altsvc_save(data, data->asi, data->set.str[STRING_ALTSVC]);
  Curl_altsvc_cleanup(&data->asi);
#endif
#ifndef CURL_DISABLE_HSTS
  Curl_hsts_save(data, data->hsts, data->set.str[STRING_HSTS]);
  if(!data->share || !data->share->hsts)
    Curl_hsts_cleanup(&data->hsts);
  curl_slist_free_all(data->state.hstslist); /* clean up list */
#endif
#if !defined(CURL_DISABLE_HTTP) && !defined(CURL_DISABLE_DIGEST_AUTH)
  Curl_http_auth_cleanup_digest(data);
#endif
  Curl_safefree(data->state.most_recent_ftp_entrypath);
  Curl_safefree(data->info.contenttype);
  Curl_safefree(data->info.wouldredirect);

  Curl_async_destroy(data);

  data_priority_cleanup(data);

  /* No longer a dirty share, if it exists */
  if(data->share) {
    Curl_share_lock(data, CURL_LOCK_DATA_SHARE, CURL_LOCK_ACCESS_SINGLE);
    data->share->dirty--;
    Curl_share_unlock(data, CURL_LOCK_DATA_SHARE);
  }

  Curl_hash_destroy(&data->meta_hash);
#ifndef CURL_DISABLE_PROXY
  Curl_safefree(data->state.aptr.proxyuserpwd);
#endif
  Curl_safefree(data->state.aptr.uagent);
  Curl_safefree(data->state.aptr.userpwd);
  Curl_safefree(data->state.aptr.accept_encoding);
  Curl_safefree(data->state.aptr.te);
  Curl_safefree(data->state.aptr.rangeline);
  Curl_safefree(data->state.aptr.ref);
  Curl_safefree(data->state.aptr.host);
#ifndef CURL_DISABLE_COOKIES
  Curl_safefree(data->state.aptr.cookiehost);
#endif
#ifndef CURL_DISABLE_RTSP
  Curl_safefree(data->state.aptr.rtsp_transport);
#endif
  Curl_safefree(data->state.aptr.user);
  Curl_safefree(data->state.aptr.passwd);
#ifndef CURL_DISABLE_PROXY
  Curl_safefree(data->state.aptr.proxyuser);
  Curl_safefree(data->state.aptr.proxypasswd);
#endif

#if !defined(CURL_DISABLE_HTTP) && !defined(CURL_DISABLE_FORM_API)
  Curl_mime_cleanpart(data->state.formp);
  Curl_safefree(data->state.formp);
#endif

  /* destruct wildcard structures if it is needed */
  Curl_wildcard_dtor(&data->wildcard);
  Curl_freeset(data);
  Curl_headers_cleanup(data);
  Curl_netrc_cleanup(&data->state.netrc);
  free(data);
  return CURLE_OK;
}